

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O2

void __thiscall
RenX_LoggingPlugin::RenX_OnHostAdminPMessage
          (RenX_LoggingPlugin *this,Server *server,PlayerInfo *player,string_view message)

{
  code *pcVar1;
  string msg;
  
  if ((*(uint *)&this->field_0xa0 >> 0x10 & 1) == 0) {
    pcVar1 = RenX::Server::sendAdmChan;
  }
  else {
    pcVar1 = RenX::Server::sendLogChan;
  }
  std::__cxx11::string::string((string *)&msg,&this->pAdminMsgFmt);
  if (msg._M_string_length != 0) {
    RenX::processTags((string *)&msg,server,(PlayerInfo *)0x0,player,(BuildingInfo *)0x0);
    RenX::replace_tag(&msg,*(undefined8 *)(RenX::tags + 0x210),*(undefined8 *)(RenX::tags + 0x208),4
                      ,"Host");
    RenX::replace_tag(&msg,*(undefined8 *)(RenX::tags + 0x230),*(undefined8 *)(RenX::tags + 0x228),4
                      ,"Host");
    RenX::replace_tag(&msg,*(undefined8 *)(RenX::tags + 0x1510),*(undefined8 *)(RenX::tags + 0x1508)
                      ,message._M_len,message._M_str);
    (*pcVar1)(server,msg._M_string_length,msg._M_dataplus._M_p);
  }
  std::__cxx11::string::~string((string *)&msg);
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnHostAdminPMessage(RenX::Server &server, const RenX::PlayerInfo &player, std::string_view message)
{
	logFuncType func;
	if (RenX_LoggingPlugin::adminPMessagePublic)
		func = &RenX::Server::sendLogChan;
	else
		func = &RenX::Server::sendAdmChan;

	std::string msg = this->pAdminMsgFmt;
	if (!msg.empty())
	{
		RenX::processTags(msg, &server, nullptr, &player);
		RenX::replace_tag(msg, RenX::tags->INTERNAL_NAME_TAG, "Host"sv);
		RenX::replace_tag(msg, RenX::tags->INTERNAL_RAW_NAME_TAG, "Host"sv);
		RenX::replace_tag(msg, RenX::tags->INTERNAL_MESSAGE_TAG, message);
		(server.*func)(msg);
	}
}